

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O3

void __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::DoMarkArgsAsVars<mp::SOS_1or2_Constraint<1>>
          (Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,SOS_1or2_Constraint<1> *con,int param_2)

{
  pointer piVar1;
  pointer piVar2;
  int local_64;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  _Any_data local_40;
  code *local_30;
  
  std::function<void_(int)>::function
            ((function<void_(int)> *)&local_40,(function<void_(int)> *)this);
  std::function<void_(int)>::function
            ((function<void_(int)> *)&local_60,(function<void_(int)> *)&local_40);
  piVar2 = (con->v_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  piVar1 = (con->v_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar2 != piVar1) {
    do {
      local_64 = *piVar2;
      if (local_50 == (code *)0x0) {
        std::__throw_bad_function_call();
      }
      (*local_48)(&local_60,&local_64);
      piVar2 = piVar2 + 1;
    } while (piVar2 != piVar1);
  }
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,__destroy_functor);
  }
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return;
}

Assistant:

void DoMarkArgsAsVars(const Con& con, int ) {
    VisitArguments(con, MarkVar_);
  }